

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

boolean the_unique_obj(obj *obj)

{
  short sVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  
  uVar2 = *(uint *)&obj->field_0x4a;
  if ((uVar2 & 0x20) == 0) {
    bVar3 = 0;
  }
  else {
    sVar1 = obj->otyp;
    bVar3 = 1;
    if ((uVar2 & 0x10) != 0 || (long)sVar1 != 0xd8) {
      bVar4 = objects[sVar1].field_0x10 & 0x40;
      bVar3 = bVar4 >> 6;
      if (((uVar2 & 0x10) == 0) && (bVar4 != 0)) {
        return sVar1 == 0xd9;
      }
    }
  }
  return bVar3;
}

Assistant:

boolean the_unique_obj(const struct obj *obj)
{
    if (!obj->dknown)
	return FALSE;
    else if (obj->otyp == FAKE_AMULET_OF_YENDOR && !obj->known)
	return TRUE;		/* lie */
    else
	return (boolean)(objects[obj->otyp].oc_unique &&
			 (obj->known || obj->otyp == AMULET_OF_YENDOR));
}